

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O1

void __thiscall cmDocumentation::cmDocumentation(cmDocumentation *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->NameString)._M_dataplus._M_p = (pointer)&(this->NameString).field_2;
  (this->NameString)._M_string_length = 0;
  (this->NameString).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->AllSections)._M_t._M_impl.super__Rb_tree_header;
  (this->AllSections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->AllSections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->AllSections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->AllSections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->AllSections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->CurrentArgument)._M_dataplus._M_p = (pointer)&(this->CurrentArgument).field_2;
  (this->CurrentArgument)._M_string_length = 0;
  (this->CurrentArgument).field_2._M_local_buf[0] = '\0';
  (this->RequestedHelpItems).
  super__Vector_base<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RequestedHelpItems).
  super__Vector_base<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RequestedHelpItems).
  super__Vector_base<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmDocumentationFormatter::cmDocumentationFormatter(&this->Formatter);
  addCommonStandardDocSections(this);
  this->ShowGenerators = true;
  return;
}

Assistant:

cmDocumentation::cmDocumentation()
{
  this->addCommonStandardDocSections();
  this->ShowGenerators = true;
}